

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cc
# Opt level: O0

Range * re2c::Range::sub(Range *r1,Range *r2)

{
  uint32_t *puVar1;
  bool bVar2;
  uint32_t local_38;
  uint32_t ub;
  uint32_t lb;
  Range **ptail;
  Range *head;
  Range *r2_local;
  Range *r1_local;
  
  ptail = (Range **)0x0;
  _ub = (Range **)&ptail;
  head = r2;
  r2_local = r1;
  while (r2_local != (Range *)0x0) {
    if ((head == (Range *)0x0) || (r2_local->ub <= head->lb)) {
      append((Range ***)&ub,r2_local->lb,r2_local->ub);
      r2_local = r2_local->nx;
    }
    else if (r2_local->lb < head->ub) {
      if (r2_local->lb < head->lb) {
        append((Range ***)&ub,r2_local->lb,head->lb);
      }
      while( true ) {
        bVar2 = false;
        if (head != (Range *)0x0) {
          bVar2 = head->ub < r2_local->ub;
        }
        if (!bVar2) break;
        puVar1 = &head->ub;
        head = head->nx;
        if ((head == (Range *)0x0) || (r2_local->ub <= head->lb)) {
          local_38 = r2_local->ub;
        }
        else {
          local_38 = head->lb;
        }
        append((Range ***)&ub,*puVar1,local_38);
      }
      r2_local = r2_local->nx;
    }
    else {
      head = head->nx;
    }
  }
  return (Range *)ptail;
}

Assistant:

Range * Range::sub (const Range * r1, const Range * r2)
{
	Range * head = NULL;
	Range ** ptail = &head;
	while (r1)
	{
		if (!r2 || r2->lb >= r1->ub)
		{
			append (ptail, r1->lb, r1->ub);
			r1 = r1->nx;
		}
		else if (r2->ub <= r1->lb)
		{
			r2 = r2->nx;
		}
		else
		{
			if (r1->lb < r2->lb)
			{
				append (ptail, r1->lb, r2->lb);
			}
			while (r2 && r2->ub < r1->ub)
			{
				const uint32_t lb = r2->ub;
				r2 = r2->nx;
				const uint32_t ub = r2 && r2->lb < r1->ub
					? r2->lb
					: r1->ub;
				append (ptail, lb, ub);
			}
			r1 = r1->nx;
		}
	}
	return head;
}